

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O2

void __thiscall CGL::Matrix3x3::operator/=(Matrix3x3 *this,double x)

{
  double rx;
  double local_18;
  
  local_18 = 1.0 / x;
  Vector3D::operator*=(this->entries,&local_18);
  Vector3D::operator*=(this->entries + 1,&local_18);
  Vector3D::operator*=(this->entries + 2,&local_18);
  return;
}

Assistant:

void Matrix3x3::operator/=( double x ) {
    Matrix3x3& A( *this );
    double rx = 1./x;

    A[0] *= rx;
    A[1] *= rx;
    A[2] *= rx;
  }